

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O1

void __thiscall QXcbEglIntegration::QXcbEglIntegration(QXcbEglIntegration *this)

{
  QTextStream *this_00;
  long lVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QTextStream *local_38;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QXcbGlIntegration::QXcbGlIntegration(&this->super_QXcbGlIntegration);
  *(undefined ***)this = &PTR__QXcbEglIntegration_0010d168;
  *(undefined ***)&this->super_QEGLIntegration = &PTR__QXcbEglIntegration_0010d1d0;
  (this->m_native_interface_handler).d = (QXcbEglNativeInterfaceHandler *)0x0;
  this->m_connection = (QXcbConnection *)0x0;
  this->m_egl_display = (EGLDisplay)0x0;
  this->m_using_platform_display = false;
  lVar1 = QtPrivateLogging::lcQpaGl();
  if ((*(byte *)(lVar1 + 0x10) & 1) != 0) {
    QMessageLogger::debug();
    this_00 = local_38;
    QVar2.m_data = (storage_type *)0x1e;
    QVar2.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<(this_00,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_38[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_38,' ');
    }
    QDebug::~QDebug((QDebug *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXcbEglIntegration::QXcbEglIntegration()
    : m_connection(nullptr)
    , m_egl_display(EGL_NO_DISPLAY)
    , m_using_platform_display(false)
{
    qCDebug(lcQpaGl) << "Xcb EGL gl-integration created";
}